

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_ary.c
# Opt level: O3

void fiobj_ary_unshift(FIOBJ ary,FIOBJ obj)

{
  void *ptr;
  void *pvVar1;
  int *piVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  if ((((ary != 0) && ((~(uint)ary & 6) != 0)) && ((ary & 1) == 0)) &&
     (*(char *)(ary & 0xfffffffffffffff8) == ')')) {
    lVar3 = *(long *)(ary + 8);
    if (lVar3 == 0) {
      ptr = *(void **)(ary + 0x20);
      uVar5 = *(ulong *)(ary + 0x10);
      uVar7 = (uVar5 & 0xfffffffffffffffe) + 10;
      if (uVar7 < *(ulong *)(ary + 0x18)) {
        uVar4 = 0;
        pvVar1 = ptr;
        uVar7 = *(ulong *)(ary + 0x18);
        uVar6 = uVar5;
      }
      else {
        pvVar1 = fio_malloc(uVar7 * 8);
        *(void **)(ary + 0x20) = pvVar1;
        if (pvVar1 == (void *)0x0) {
          if (0 < FIO_LOG_LEVEL) {
            FIO_LOG2STDERR(
                          "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.h:4933"
                          );
          }
          kill(0,2);
          piVar2 = __errno_location();
          exit(*piVar2);
        }
        *(ulong *)(ary + 0x18) = uVar7;
        uVar4 = *(ulong *)(ary + 8);
        uVar5 = *(ulong *)(ary + 0x10);
        uVar6 = uVar5 - uVar4;
      }
      *(ulong *)(ary + 0x10) = uVar7;
      if (uVar5 != uVar4) {
        memmove((void *)((long)pvVar1 + (uVar7 - uVar6) * 8),(void *)((long)ptr + uVar4 * 8),
                uVar6 * 8);
        uVar7 = *(ulong *)(ary + 0x10);
        pvVar1 = *(void **)(ary + 0x20);
      }
      lVar3 = uVar7 - uVar6;
      *(long *)(ary + 8) = lVar3;
      if (ptr != pvVar1) {
        fio_free(ptr);
        lVar3 = *(long *)(ary + 8);
      }
    }
    *(long *)(ary + 8) = lVar3 + -1;
    *(FIOBJ *)(*(long *)(ary + 0x20) + -8 + lVar3 * 8) = obj;
    return;
  }
  __assert_fail("ary && FIOBJ_TYPE_IS(ary, FIOBJ_T_ARRAY)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_ary.c"
                ,0xab,"void fiobj_ary_unshift(FIOBJ, FIOBJ)");
}

Assistant:

void fiobj_ary_unshift(FIOBJ ary, FIOBJ obj) {
  assert(ary && FIOBJ_TYPE_IS(ary, FIOBJ_T_ARRAY));
  fio_ary___unshift(&obj2ary(ary)->ary, obj);
}